

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::str_format_internal::FormatSinkImpl::PutPaddedString
          (FormatSinkImpl *this,string_view value,int width,int precision,bool left)

{
  ulong uVar1;
  ulong uVar2;
  undefined3 in_register_00000089;
  ulong uVar3;
  string_view v;
  string_view v_00;
  
  v._M_str = value._M_str;
  uVar2 = value._M_len;
  uVar1 = (ulong)(uint)width;
  if (width < 1) {
    uVar1 = 0;
  }
  uVar3 = (ulong)(uint)precision;
  if (uVar2 <= (uint)precision) {
    uVar3 = uVar2;
  }
  if (precision < 0) {
    uVar3 = uVar2;
  }
  uVar2 = 0;
  if (uVar3 <= uVar1) {
    uVar2 = uVar1 - uVar3;
  }
  if (CONCAT31(in_register_00000089,left) == 0) {
    Append(this,uVar2,' ');
    v_00._M_str = v._M_str;
    v_00._M_len = uVar3;
    Append(this,v_00);
  }
  else {
    v._M_len = uVar3;
    Append(this,v);
    Append(this,uVar2,' ');
  }
  return true;
}

Assistant:

bool FormatSinkImpl::PutPaddedString(string_view value, int width,
                                     int precision, bool left) {
  size_t space_remaining = 0;
  if (width >= 0)
    space_remaining = static_cast<size_t>(width);
  size_t n = value.size();
  if (precision >= 0) n = std::min(n, static_cast<size_t>(precision));
  string_view shown(value.data(), n);
  space_remaining = Excess(shown.size(), space_remaining);
  if (!left) Append(space_remaining, ' ');
  Append(shown);
  if (left) Append(space_remaining, ' ');
  return true;
}